

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall ncnn::Net::clear(Net *this)

{
  pointer ppLVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::clear(&this->blobs);
  uVar5 = 0;
  while( true ) {
    ppLVar1 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppLVar2 - (long)ppLVar1 >> 3) <= uVar5) break;
    iVar4 = (*ppLVar1[uVar5]->_vptr_Layer[5])(ppLVar1[uVar5],this);
    if (iVar4 != 0) {
      fwrite("layer destroy_pipeline failed\n",0x1e,1,_stderr);
    }
    pLVar3 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar5];
    if (pLVar3 != (Layer *)0x0) {
      (*pLVar3->_vptr_Layer[1])();
    }
    uVar5 = uVar5 + 1;
  }
  if (ppLVar2 != ppLVar1) {
    (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar1;
  }
  return;
}

Assistant:

void Net::clear()
{
#if NCNN_VULKAN
    destroy_pipeline();
#endif // NCNN_VULKAN

    blobs.clear();
    for (size_t i=0; i<layers.size(); i++)
    {
        int dret = layers[i]->destroy_pipeline(opt);
        if (dret != 0)
        {
            fprintf(stderr, "layer destroy_pipeline failed\n");
            // ignore anyway
        }

        delete layers[i];
    }
    layers.clear();

#if NCNN_VULKAN
    if (weight_vkallocator)
    {
        delete weight_vkallocator;
        weight_vkallocator = 0;
    }
    if (weight_staging_vkallocator)
    {
        delete weight_staging_vkallocator;
        weight_staging_vkallocator = 0;
    }
#endif // NCNN_VULKAN
}